

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbintegration.cpp
# Opt level: O0

void __thiscall
QLinuxFbIntegration::QLinuxFbIntegration(QLinuxFbIntegration *this,QStringList *paramList)

{
  int iVar1;
  QPlatformFontDatabase *p;
  QStringList *args;
  QPlatformIntegration *in_RDI;
  QStringList *in_stack_ffffffffffffffc8;
  QLinuxFbScreen *in_stack_ffffffffffffffd0;
  
  QPlatformIntegration::QPlatformIntegration(in_RDI);
  QPlatformNativeInterface::QPlatformNativeInterface
            ((QPlatformNativeInterface *)in_stack_ffffffffffffffd0);
  QNativeInterface::Private::QEvdevKeyMapper::QEvdevKeyMapper((QEvdevKeyMapper *)(in_RDI + 0x18));
  *(undefined ***)in_RDI = &PTR__QLinuxFbIntegration_001a77a8;
  *(undefined ***)(in_RDI + 8) = &PTR_metaObject_001a78e8;
  *(undefined ***)(in_RDI + 0x18) = &PTR__QLinuxFbIntegration_001a79d8;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  p = (QPlatformFontDatabase *)operator_new(8);
  QFontconfigDatabase::QFontconfigDatabase((QFontconfigDatabase *)in_stack_ffffffffffffffd0);
  QScopedPointer<QPlatformFontDatabase,_QScopedPointerDeleter<QPlatformFontDatabase>_>::
  QScopedPointer((QScopedPointer<QPlatformFontDatabase,_QScopedPointerDeleter<QPlatformFontDatabase>_>
                  *)(in_RDI + 0x30),p);
  QScopedPointer<QPlatformServices,_QScopedPointerDeleter<QPlatformServices>_>::QScopedPointer
            ((QScopedPointer<QPlatformServices,_QScopedPointerDeleter<QPlatformServices>_> *)
             (in_RDI + 0x38),(QPlatformServices *)0x0);
  QScopedPointer<QFbVtHandler,_QScopedPointerDeleter<QFbVtHandler>_>::QScopedPointer
            ((QScopedPointer<QFbVtHandler,_QScopedPointerDeleter<QFbVtHandler>_> *)(in_RDI + 0x40),
             (QFbVtHandler *)0x0);
  *(undefined8 *)(in_RDI + 0x48) = 0;
  iVar1 = qEnvironmentVariableIntValue("QT_QPA_FB_DRM",(bool *)0x0);
  if (iVar1 != 0) {
    in_stack_ffffffffffffffd0 = (QLinuxFbScreen *)operator_new(0xc0);
    QLinuxFbDrmScreen::QLinuxFbDrmScreen
              ((QLinuxFbDrmScreen *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *(QLinuxFbScreen **)(in_RDI + 0x20) = in_stack_ffffffffffffffd0;
  }
  if (*(long *)(in_RDI + 0x20) == 0) {
    args = (QStringList *)operator_new(0x108);
    QLinuxFbScreen::QLinuxFbScreen(in_stack_ffffffffffffffd0,args);
    *(QStringList **)(in_RDI + 0x20) = args;
  }
  return;
}

Assistant:

QLinuxFbIntegration::QLinuxFbIntegration(const QStringList &paramList)
    : m_primaryScreen(nullptr),
      m_fontDb(new QGenericUnixFontDatabase)
{
#if QT_CONFIG(kms)
    if (qEnvironmentVariableIntValue("QT_QPA_FB_DRM") != 0)
        m_primaryScreen = new QLinuxFbDrmScreen(paramList);
#endif
    if (!m_primaryScreen)
        m_primaryScreen = new QLinuxFbScreen(paramList);
}